

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

int __thiscall
kratos::LatchStmtBlock::clone
          (LatchStmtBlock *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  element_type *peVar1;
  StmtBlock *local_30;
  shared_ptr<kratos::LatchStmtBlock> stmt;
  
  std::make_shared<kratos::LatchStmtBlock>();
  StmtBlock::clone_block((StmtBlock *)__fn,local_30);
  peVar1 = stmt.super___shared_ptr<kratos::LatchStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode = (_func_int **)local_30;
  stmt.super___shared_ptr<kratos::LatchStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_StmtBlock).super_Stmt.super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)peVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> LatchStmtBlock::clone() const {
    auto stmt = std::make_shared<LatchStmtBlock>();
    clone_block(stmt.get());
    return stmt;
}